

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

void __thiscall Glucose::SimpSolver::relocAll(SimpSolver *this,ClauseAllocator *to)

{
  int iVar1;
  vec<unsigned_int> *this_00;
  long in_RDI;
  ClauseAllocator *in_stack_00000010;
  CRef *in_stack_00000018;
  ClauseAllocator *in_stack_00000020;
  int i_1;
  int j;
  vec<unsigned_int> *cs;
  int i;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>
  *in_stack_ffffffffffffffb0;
  int local_28;
  int local_24;
  int local_14;
  
  if ((*(byte *)(in_RDI + 0x4d0) & 1) != 0) {
    for (local_14 = 0; iVar1 = Solver::nVars((Solver *)0x130e70), local_14 < iVar1;
        local_14 = local_14 + 1) {
      this_00 = OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::
                operator[](in_stack_ffffffffffffffb0,
                           (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      for (local_24 = 0; iVar1 = vec<unsigned_int>::size(this_00), local_24 < iVar1;
          local_24 = local_24 + 1) {
        vec<unsigned_int>::operator[](this_00,local_24);
        ClauseAllocator::reloc(in_stack_00000020,in_stack_00000018,in_stack_00000010);
      }
    }
    for (local_28 = 0;
        iVar1 = Queue<unsigned_int>::size((Queue<unsigned_int> *)in_stack_ffffffffffffffb0),
        local_28 < iVar1; local_28 = local_28 + 1) {
      in_stack_ffffffffffffffb0 =
           (OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted> *)
           (in_RDI + 0x340);
      Queue<unsigned_int>::operator[]
                ((Queue<unsigned_int> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      ClauseAllocator::reloc(in_stack_00000020,in_stack_00000018,in_stack_00000010);
    }
    ClauseAllocator::reloc(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  }
  return;
}

Assistant:

void SimpSolver::relocAll(ClauseAllocator& to)
{
    if (!use_simplification) return;

    // All occurs lists:
    //
    for (int i = 0; i < nVars(); i++){
        vec<CRef>& cs = occurs[i];
        for (int j = 0; j < cs.size(); j++)
            ca.reloc(cs[j], to);
    }

    // Subsumption queue:
    //
    for (int i = 0; i < subsumption_queue.size(); i++)
        ca.reloc(subsumption_queue[i], to);

    // Temporary clause:
    //
    ca.reloc(bwdsub_tmpunit, to);
}